

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderLineStrip<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLog>
               (GetterXsYs<unsigned_long_long> *getter,TransformerLogLog *transformer,
               ImDrawList *DrawList,float line_weight,ImU32 col)

{
  float *pfVar1;
  float fVar2;
  unsigned_long_long uVar3;
  unsigned_long_long uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  ImPlotPlot *pIVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  ImPlotContext *pIVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  ImPlotContext *gp;
  float fVar17;
  ImVec2 p2;
  ImVec2 p1;
  ImVec2 local_80;
  double local_78;
  double dStack_70;
  ImDrawList *local_60;
  undefined1 local_58 [8];
  TransformerLogLog *local_50;
  int local_48;
  ImU32 local_44;
  float local_40;
  ImVec2 local_3c;
  
  pIVar12 = GImPlot;
  pIVar9 = GImPlot->CurrentPlot;
  local_60 = DrawList;
  if (((pIVar9->Flags & 0x1000) == 0) && ((GImPlot->Style).AntiAliasedLines != true)) {
    iVar15 = getter->Count;
    local_48 = iVar15 + -1;
    local_3c.x = 0.0;
    local_3c.y = 0.0;
    lVar14 = (long)((getter->Offset % iVar15 + iVar15) % iVar15) * (long)getter->Stride;
    uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar14);
    uVar4 = *(unsigned_long_long *)((long)getter->Ys + lVar14);
    dStack_70 = (double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25;
    local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    local_58 = (undefined1  [8])getter;
    local_50 = transformer;
    local_44 = col;
    local_40 = line_weight;
    dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                   (pIVar9->XAxis).Range.Min);
    dVar5 = pIVar12->LogDenX;
    pIVar9 = pIVar12->CurrentPlot;
    dVar6 = (pIVar9->XAxis).Range.Min;
    dVar7 = (pIVar9->XAxis).Range.Max;
    dVar11 = log10(local_78 / pIVar9->YAxis[transformer->YAxis].Range.Min);
    iVar15 = transformer->YAxis;
    pIVar9 = pIVar12->CurrentPlot;
    dVar8 = pIVar9->YAxis[iVar15].Range.Min;
    local_3c.x = (float)((((double)(float)(dVar10 / dVar5) * (dVar7 - dVar6) + dVar6) -
                         (pIVar9->XAxis).Range.Min) * pIVar12->Mx +
                        (double)pIVar12->PixelRange[iVar15].Min.x);
    local_3c.y = (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar15]) *
                           (pIVar9->YAxis[iVar15].Range.Max - dVar8) + dVar8) - dVar8) *
                         pIVar12->My[iVar15] + (double)pIVar12->PixelRange[iVar15].Min.y);
    RenderPrimitives<ImPlot::LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,ImPlot::TransformerLogLog>>
              ((LineStripRenderer<ImPlot::GetterXsYs<unsigned_long_long>,_ImPlot::TransformerLogLog>
                *)local_58,local_60,&pIVar9->PlotRect);
  }
  else {
    iVar15 = getter->Count;
    lVar14 = (long)((getter->Offset % iVar15 + iVar15) % iVar15) * (long)getter->Stride;
    uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar14);
    uVar4 = *(unsigned_long_long *)((long)getter->Ys + lVar14);
    dStack_70 = (double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25;
    local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
    dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                   (pIVar9->XAxis).Range.Min);
    dVar5 = pIVar12->LogDenX;
    pIVar9 = pIVar12->CurrentPlot;
    dVar6 = (pIVar9->XAxis).Range.Min;
    dVar7 = (pIVar9->XAxis).Range.Max;
    dVar11 = log10(local_78 / pIVar9->YAxis[transformer->YAxis].Range.Min);
    iVar15 = transformer->YAxis;
    pIVar9 = pIVar12->CurrentPlot;
    dVar8 = pIVar9->YAxis[iVar15].Range.Min;
    local_58._0_4_ =
         (undefined4)
         ((((double)(float)(dVar10 / dVar5) * (dVar7 - dVar6) + dVar6) - (pIVar9->XAxis).Range.Min)
          * pIVar12->Mx + (double)pIVar12->PixelRange[iVar15].Min.x);
    local_58._4_4_ =
         (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar15]) *
                   (pIVar9->YAxis[iVar15].Range.Max - dVar8) + dVar8) - dVar8) * pIVar12->My[iVar15]
                + (double)pIVar12->PixelRange[iVar15].Min.y);
    iVar15 = getter->Count;
    if (1 < iVar15) {
      iVar16 = 1;
      do {
        pIVar13 = GImPlot;
        lVar14 = (long)(((getter->Offset + iVar16) % iVar15 + iVar15) % iVar15) *
                 (long)getter->Stride;
        uVar3 = *(unsigned_long_long *)((long)getter->Xs + lVar14);
        uVar4 = *(unsigned_long_long *)((long)getter->Ys + lVar14);
        dStack_70 = (double)CONCAT44(0x45300000,(int)(uVar4 >> 0x20)) - 1.9342813113834067e+25;
        local_78 = dStack_70 + ((double)CONCAT44(0x43300000,(int)uVar4) - 4503599627370496.0);
        dVar10 = log10((((double)CONCAT44(0x45300000,(int)(uVar3 >> 0x20)) - 1.9342813113834067e+25)
                       + ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0)) /
                       (GImPlot->CurrentPlot->XAxis).Range.Min);
        dVar5 = pIVar13->LogDenX;
        pIVar9 = pIVar13->CurrentPlot;
        dVar6 = (pIVar9->XAxis).Range.Min;
        dVar7 = (pIVar9->XAxis).Range.Max;
        dVar11 = log10(local_78 / pIVar9->YAxis[transformer->YAxis].Range.Min);
        iVar15 = transformer->YAxis;
        pIVar9 = pIVar13->CurrentPlot;
        dVar8 = pIVar9->YAxis[iVar15].Range.Min;
        local_80.x = (float)((((double)(float)(dVar10 / dVar5) * (dVar7 - dVar6) + dVar6) -
                             (pIVar9->XAxis).Range.Min) * pIVar13->Mx +
                            (double)pIVar13->PixelRange[iVar15].Min.x);
        fVar17 = (float)((((double)(float)(dVar11 / pIVar13->LogDenY[iVar15]) *
                           (pIVar9->YAxis[iVar15].Range.Max - dVar8) + dVar8) - dVar8) *
                         pIVar13->My[iVar15] + (double)pIVar13->PixelRange[iVar15].Min.y);
        local_80.y = fVar17;
        pIVar9 = pIVar12->CurrentPlot;
        fVar2 = (float)local_58._4_4_;
        if (fVar17 <= (float)local_58._4_4_) {
          fVar2 = fVar17;
        }
        if ((fVar2 < (pIVar9->PlotRect).Max.y) &&
           (fVar2 = (float)(~-(uint)(fVar17 <= (float)local_58._4_4_) & (uint)fVar17 |
                           local_58._4_4_ & -(uint)(fVar17 <= (float)local_58._4_4_)),
           pfVar1 = &(pIVar9->PlotRect).Min.y, *pfVar1 <= fVar2 && fVar2 != *pfVar1)) {
          fVar2 = (float)local_58._0_4_;
          if (local_80.x <= (float)local_58._0_4_) {
            fVar2 = local_80.x;
          }
          if ((fVar2 < (pIVar9->PlotRect).Max.x) &&
             (fVar2 = (float)(~-(uint)(local_80.x <= (float)local_58._0_4_) & (uint)local_80.x |
                             local_58._0_4_ & -(uint)(local_80.x <= (float)local_58._0_4_)),
             (pIVar9->PlotRect).Min.x <= fVar2 && fVar2 != (pIVar9->PlotRect).Min.x)) {
            ImDrawList::AddLine(local_60,(ImVec2 *)local_58,&local_80,col,line_weight);
          }
        }
        local_58._0_4_ = local_80.x;
        local_58._4_4_ = local_80.y;
        iVar16 = iVar16 + 1;
        iVar15 = getter->Count;
      } while (iVar16 < iVar15);
    }
  }
  return;
}

Assistant:

inline void RenderLineStrip(const Getter& getter, const Transformer& transformer, ImDrawList& DrawList, float line_weight, ImU32 col) {
    ImPlotContext& gp = *GImPlot;
    if (ImHasFlag(gp.CurrentPlot->Flags, ImPlotFlags_AntiAliased) || gp.Style.AntiAliasedLines) {
        ImVec2 p1 = transformer(getter(0));
        for (int i = 1; i < getter.Count; ++i) {
            ImVec2 p2 = transformer(getter(i));
            if (gp.CurrentPlot->PlotRect.Overlaps(ImRect(ImMin(p1, p2), ImMax(p1, p2))))
                DrawList.AddLine(p1, p2, col, line_weight);
            p1 = p2;
        }
    }
    else {
        RenderPrimitives(LineStripRenderer<Getter,Transformer>(getter, transformer, col, line_weight), DrawList, gp.CurrentPlot->PlotRect);
    }
}